

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmnutils.cpp
# Opt level: O1

int __thiscall JSONElement::operator_cast_to_int(JSONElement *this)

{
  char cVar1;
  jsmntok_t *pjVar2;
  long lVar3;
  JSMNUtilsEx *this_00;
  char *endptr;
  char buffer [32];
  char *local_40;
  char local_38 [40];
  
  pjVar2 = this->m_tokens;
  if ((((pjVar2 != (jsmntok_t *)0x0) && (this->m_toksize != 0)) && (this->m_buffer != (char *)0x0))
     && ((pjVar2->type == JSMN_PRIMITIVE &&
         (cVar1 = this->m_buffer[pjVar2->start], cVar1 == '-' || 0xf5 < (byte)(cVar1 - 0x3aU))))) {
    strncpy(local_38,this->m_buffer + pjVar2->start,(long)pjVar2->end - (long)pjVar2->start);
    local_38[(long)pjVar2->end - (long)pjVar2->start] = '\0';
    lVar3 = strtol(local_38,&local_40,10);
    if (*local_40 == '\0') {
      return (int)lVar3;
    }
  }
  this_00 = (JSMNUtilsEx *)__cxa_allocate_exception(0x10);
  JSMNUtilsEx::JSMNUtilsEx(this_00,&jsmn_invalid_type_ex);
  __cxa_throw(this_00,&JSMNUtilsEx::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool JSONElement::is_valid() const
{
    return m_tokens != NULL &&
        m_toksize > 0 && m_buffer != NULL;
}